

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O1

int Abc_NtkMiterSatBm(Abc_Ntk_t *pNtk,ABC_INT64_T nConfLimit,ABC_INT64_T nInsLimit,int fVerbose,
                     ABC_INT64_T *pNumConfs,ABC_INT64_T *pNumInspects)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Vec_Int_t *__ptr;
  int *piVar4;
  timespec ts;
  timespec local_40;
  
  if (pNumConfs != (ABC_INT64_T *)0x0) {
    *pNumConfs = 0;
  }
  if (pNumInspects != (ABC_INT64_T *)0x0) {
    *pNumInspects = 0;
  }
  if (pNtk->nObjCounts[8] == 0) {
    clock_gettime(3,&local_40);
    Abc_NtkMiterSatBm::pSat = (sat_solver *)Abc_NtkMiterSatCreate(pNtk,0);
    if (Abc_NtkMiterSatBm::pSat == (sat_solver *)0x0) {
      iVar1 = 1;
    }
    else {
      clock_gettime(3,&local_40);
      iVar1 = sat_solver_simplify(Abc_NtkMiterSatBm::pSat);
      if ((char)iVar1 == '\0') {
        iVar1 = 1;
      }
      else {
        clock_gettime(3,&local_40);
        if (fVerbose != 0) {
          Abc_NtkMiterSatBm::pSat->verbosity = 1;
        }
        uVar2 = sat_solver_solve(Abc_NtkMiterSatBm::pSat,(lit *)0x0,(lit *)0x0,nConfLimit,nInsLimit,
                                 0,0);
        iVar3 = uVar2 << 0x18;
        if (iVar3 == -0x1000000) {
          iVar1 = 1;
        }
        else {
          iVar1 = -1;
          if ((uVar2 & 0xff) != 0) {
            if (iVar3 != 0x1000000) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcBm.c"
                            ,0x3ac,
                            "int Abc_NtkMiterSatBm(Abc_Ntk_t *, ABC_INT64_T, ABC_INT64_T, int, ABC_INT64_T *, ABC_INT64_T *)"
                           );
            }
            iVar1 = 0;
          }
        }
        if (iVar3 == 0x1000000) {
          __ptr = Abc_NtkGetCiSatVarNums(pNtk);
          piVar4 = Sat_SolverGetModel(Abc_NtkMiterSatBm::pSat,__ptr->pArray,__ptr->nSize);
          pNtk->pModel = piVar4;
          if (__ptr->pArray != (int *)0x0) {
            free(__ptr->pArray);
            __ptr->pArray = (int *)0x0;
          }
          if (__ptr != (Vec_Int_t *)0x0) {
            free(__ptr);
          }
        }
        if (fVerbose != 0) {
          Sat_SolverPrintStats(_stdout,Abc_NtkMiterSatBm::pSat);
        }
        if (pNumConfs != (ABC_INT64_T *)0x0) {
          *pNumConfs = (long)(int)(Abc_NtkMiterSatBm::pSat->stats).conflicts;
        }
        if (pNumInspects != (ABC_INT64_T *)0x0) {
          *pNumInspects = (long)(int)(Abc_NtkMiterSatBm::pSat->stats).inspects;
        }
        sat_solver_store_free(Abc_NtkMiterSatBm::pSat);
      }
      sat_solver_delete(Abc_NtkMiterSatBm::pSat);
    }
    return iVar1;
  }
  __assert_fail("Abc_NtkLatchNum(pNtk) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcBm.c"
                ,0x376,
                "int Abc_NtkMiterSatBm(Abc_Ntk_t *, ABC_INT64_T, ABC_INT64_T, int, ABC_INT64_T *, ABC_INT64_T *)"
               );
}

Assistant:

int Abc_NtkMiterSatBm( Abc_Ntk_t * pNtk, ABC_INT64_T nConfLimit, ABC_INT64_T nInsLimit, int fVerbose, ABC_INT64_T * pNumConfs, ABC_INT64_T * pNumInspects)
{
    static sat_solver * pSat = NULL;
    lbool   status;
    int RetValue = 0;
    abctime clk;    

    extern int Abc_NodeAddClausesTop( sat_solver * pSat, Abc_Obj_t * pNode, Vec_Int_t * vVars );
    extern Vec_Int_t * Abc_NtkGetCiSatVarNums( Abc_Ntk_t * pNtk );    
 
    if ( pNumConfs )
        *pNumConfs = 0;
    if ( pNumInspects )
        *pNumInspects = 0;

    assert( Abc_NtkLatchNum(pNtk) == 0 );

//    if ( Abc_NtkPoNum(pNtk) > 1 )
//        fprintf( stdout, "Warning: The miter has %d outputs. SAT will try to prove all of them.\n", Abc_NtkPoNum(pNtk) );

    // load clauses into the sat_solver
    clk = Abc_Clock();

            
        
    pSat = (sat_solver *)Abc_NtkMiterSatCreate( pNtk, 0 );
            
    if ( pSat == NULL )
        return 1;
//printf( "%d \n", pSat->clauses.size );
//sat_solver_delete( pSat );
//return 1;

//    printf( "Created SAT problem with %d variable and %d clauses. ", sat_solver_nvars(pSat), sat_solver_nclauses(pSat) );
//    PRT( "Time", Abc_Clock() - clk );

    // simplify the problem
    clk = Abc_Clock();
    status = sat_solver_simplify(pSat);
//    printf( "Simplified the problem to %d variables and %d clauses. ", sat_solver_nvars(pSat), sat_solver_nclauses(pSat) );
//    PRT( "Time", Abc_Clock() - clk );
    if ( status == 0 )
    {
        sat_solver_delete( pSat );
//        printf( "The problem is UNSATISFIABLE after simplification.\n" );
        return 1;
    }

    // solve the miter
    clk = Abc_Clock();
    if ( fVerbose )
        pSat->verbosity = 1;
    status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)nConfLimit, (ABC_INT64_T)nInsLimit, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( status == l_Undef )
    {
//        printf( "The problem timed out.\n" );
        RetValue = -1;
    }
    else if ( status == l_True )
    {
//        printf( "The problem is SATISFIABLE.\n" );
        RetValue = 0;
    }
    else if ( status == l_False )
    {
//        printf( "The problem is UNSATISFIABLE.\n" );
        RetValue = 1;
    }
    else
        assert( 0 );
//    PRT( "SAT sat_solver time", Abc_Clock() - clk );
//    printf( "The number of conflicts = %d.\n", (int)pSat->sat_solver_stats.conflicts );

    // if the problem is SAT, get the counterexample
    if ( status == l_True )
    {
//        Vec_Int_t * vCiIds = Abc_NtkGetCiIds( pNtk );
        Vec_Int_t * vCiIds = Abc_NtkGetCiSatVarNums( pNtk );
        pNtk->pModel = Sat_SolverGetModel( pSat, vCiIds->pArray, vCiIds->nSize );
        Vec_IntFree( vCiIds );
    }
    // free the sat_solver
    if ( fVerbose )
        Sat_SolverPrintStats( stdout, pSat );

    if ( pNumConfs )
        *pNumConfs = (int)pSat->stats.conflicts;
    if ( pNumInspects )
        *pNumInspects = (int)pSat->stats.inspects;

//sat_solver_store_write( pSat, "trace.cnf" );    
    sat_solver_store_free( pSat );
    sat_solver_delete( pSat );
    return RetValue;
}